

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O0

PHYSFS_sint64 PHYSFS_fileLength(PHYSFS_File *handle)

{
  void *pvVar1;
  PHYSFS_Io *io;
  PHYSFS_sint64 retval;
  PHYSFS_File *handle_local;
  
  pvVar1 = handle->opaque;
  retval = (PHYSFS_sint64)handle;
  if (pvVar1 == (void *)0x0) {
    if ((magicStream != (FileHandle *)0x0) && (magicStream->forReading != '\0')) {
      PHYSFS_readBytes((PHYSFS_File *)magicStream,&io,8);
    }
  }
  else {
    io = (PHYSFS_Io *)(**(code **)((long)pvVar1 + 0x30))(pvVar1);
  }
  if ((magicStream != (FileHandle *)0x0) && (magicStream->forReading == '\0')) {
    PHYSFS_writeBytes((PHYSFS_File *)magicStream,&io,8);
  }
  return (PHYSFS_sint64)io;
}

Assistant:

PHYSFS_sint64 PHYSFS_fileLength(PHYSFS_File *handle)
{
    PHYSFS_sint64 retval;
    PHYSFS_Io *io = ((FileHandle *) handle)->io;
    if (io == NULL)
    {
        if (magicStream && magicStream->forReading)
            PHYSFS_readBytes((PHYSFS_File *)magicStream, &retval, sizeof(PHYSFS_sint64));
    } /* if */
    else
    {
        retval = io->length(io);
    } /* else */

    if (magicStream && !magicStream->forReading)
        PHYSFS_writeBytes((PHYSFS_File *)magicStream, &retval, sizeof(PHYSFS_sint64));

    return retval;
}